

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_getScript_63(char *localeID,char *script,int32_t scriptCapacity,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t local_34;
  int32_t i;
  UErrorCode *err_local;
  int32_t scriptCapacity_local;
  char *script_local;
  char *localeID_local;
  
  local_34 = 0;
  if ((err != (UErrorCode *)0x0) &&
     (script_local = localeID, UVar1 = U_FAILURE(*err), UVar1 == '\0')) {
    if (script_local == (char *)0x0) {
      script_local = uloc_getDefault_63();
    }
    ulocimp_getLanguage_63(script_local,(char *)0x0,0,&script_local);
    if ((*script_local == '_') || (*script_local == '-')) {
      local_34 = ulocimp_getScript_63(script_local + 1,script,scriptCapacity,(char **)0x0);
    }
    iVar2 = u_terminateChars_63(script,scriptCapacity,local_34,err);
    return iVar2;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getScript(const char*    localeID,
         char* script,
         int32_t scriptCapacity,
         UErrorCode* err)
{
    int32_t i=0;

    if(err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if(localeID==NULL) {
        localeID=uloc_getDefault();
    }

    /* skip the language */
    ulocimp_getLanguage(localeID, NULL, 0, &localeID);
    if(_isIDSeparator(*localeID)) {
        i=ulocimp_getScript(localeID+1, script, scriptCapacity, NULL);
    }
    return u_terminateChars(script, scriptCapacity, i, err);
}